

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethread.c
# Opt level: O0

void av1_global_motion_estimation_mt(AV1_COMP *cpi)

{
  int num_workers_00;
  AV1GlobalMotionSync *thread_id_to_dir;
  AV1_COMP *in_RDI;
  undefined4 unaff_retaddr;
  int num_workers;
  GlobalMotionJobInfo *job_info;
  int in_stack_000001b4;
  AV1_COMMON *in_stack_000001b8;
  MultiThreadInfo *in_stack_000001c0;
  int num_workers_01;
  
  thread_id_to_dir = &(in_RDI->mt_info).gm_sync;
  memset(thread_id_to_dir,0,0x44);
  num_workers_00 = compute_gm_workers(in_RDI);
  num_workers_01 = (int)((ulong)in_RDI >> 0x20);
  assign_thread_to_dir((int8_t *)thread_id_to_dir,num_workers_00);
  prepare_gm_workers(cpi,(AVxWorkerHook)CONCAT44(job_info._4_4_,job_info._0_4_),num_workers);
  launch_workers((MultiThreadInfo *)CONCAT44(num_workers,unaff_retaddr),num_workers_01);
  sync_enc_workers(in_stack_000001c0,in_stack_000001b8,in_stack_000001b4);
  gm_dealloc_thread_data(cpi,job_info._4_4_);
  return;
}

Assistant:

void av1_global_motion_estimation_mt(AV1_COMP *cpi) {
  GlobalMotionJobInfo *job_info = &cpi->mt_info.gm_sync.job_info;

  av1_zero(*job_info);

  int num_workers = compute_gm_workers(cpi);

  assign_thread_to_dir(job_info->thread_id_to_dir, num_workers);
  prepare_gm_workers(cpi, gm_mt_worker_hook, num_workers);
  launch_workers(&cpi->mt_info, num_workers);
  sync_enc_workers(&cpi->mt_info, &cpi->common, num_workers);
  gm_dealloc_thread_data(cpi, num_workers);
}